

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_four.cpp
# Opt level: O3

void main_program(void)

{
  double dVar1;
  ConnectFourState root_state;
  ComputeOptions options;
  bool bVar2;
  Move MVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  char cVar7;
  Move move;
  ConnectFourState state;
  undefined1 in_stack_ffffffffffffff40 [12];
  int iVar8;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  undefined4 uVar9;
  ConnectFourState local_90;
  int local_58;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  local_50;
  int local_38;
  int iStack_34;
  
  ConnectFourState::ConnectFourState(&local_90,6,7);
  while( true ) {
    bVar2 = ConnectFourState::has_moves(&local_90);
    cVar7 = (char)*(undefined8 *)(std::cout + -0x18) + -0x30;
    if (!bVar2) break;
    std::ios::widen(cVar7);
    std::ostream::put(-0x30);
    poVar4 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"State: ",7);
    ConnectFourState::print(&local_90,poVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    iVar8 = -1;
    if (local_90.player_to_move == 1) {
      local_58 = local_90.num_cols;
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::vector(&local_50,&local_90.board);
      local_38 = local_90.last_col;
      iStack_34 = local_90.last_row;
      uVar9 = CONCAT31((int3)((uint)in_stack_ffffffffffffff50 >> 8),1);
      root_state.board.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = in_stack_ffffffffffffff54;
      root_state.board.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = uVar9;
      root_state._8_8_ = 0xbff0000000000000;
      root_state.player_to_move = 8;
      root_state.num_rows = 100000;
      root_state.board.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._8_12_ = in_stack_ffffffffffffff40;
      root_state.board.
      super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = iVar8;
      root_state.last_col = in_stack_ffffffffffffff50;
      root_state.last_row = in_stack_ffffffffffffff54;
      options.max_time = -1.0;
      options.number_of_threads = 8;
      options.max_iterations = 100000;
      options._16_4_ = uVar9;
      options._20_4_ = in_stack_ffffffffffffff54;
      MVar3 = MCTS::compute_move<ConnectFourState>(root_state,options);
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::~vector(&local_50);
      ConnectFourState::do_move(&local_90,MVar3);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Input your move: ",0x11);
      MVar3 = -1;
      std::istream::operator>>((istream *)&std::cin,(int *)&stack0xffffffffffffff4c);
      ConnectFourState::do_move(&local_90,MVar3);
    }
  }
  std::ios::widen(cVar7);
  std::ostream::put(-0x30);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Final state: ",0xd);
  ConnectFourState::print(&local_90,poVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  dVar1 = ConnectFourState::get_result(&local_90,2);
  if ((dVar1 != 1.0) || (NAN(dVar1))) {
    dVar1 = ConnectFourState::get_result(&local_90,1);
    pcVar6 = "Player 2 wins!";
    if (dVar1 != 1.0) {
      pcVar6 = "Nobody wins!";
    }
    if (NAN(dVar1)) {
      pcVar6 = "Nobody wins!";
    }
    lVar5 = (ulong)(-(uint)(dVar1 == 1.0) & 1) * 2 + 0xc;
  }
  else {
    lVar5 = 0xe;
    pcVar6 = "Player 1 wins!";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::~vector(&local_90.board);
  return;
}

Assistant:

void main_program()
{
	using namespace std;

	bool human_player = true;

	MCTS::ComputeOptions player1_options, player2_options;
	player1_options.max_iterations = 100000;
	player1_options.verbose = true;
	player2_options.max_iterations =  10000;
	player2_options.verbose = true;

	ConnectFourState state;
	while (state.has_moves()) {
		cout << endl << "State: " << state << endl;

		ConnectFourState::Move move = ConnectFourState::no_move;
		if (state.player_to_move == 1) {
			move = MCTS::compute_move(state, player1_options);
			state.do_move(move);
		}
		else {
			if (human_player) {
				while (true) {
					cout << "Input your move: ";
					move = ConnectFourState::no_move;
					cin >> move;
					try {
						state.do_move(move);
						break;
					}
					catch (std::exception& ) {
						cout << "Invalid move." << endl;
					}
				}
			}
			else {
				move = MCTS::compute_move(state, player2_options);
				state.do_move(move);
			}
		}
	}

	cout << endl << "Final state: " << state << endl;

	if (state.get_result(2) == 1.0) {
		cout << "Player 1 wins!" << endl;
	}
	else if (state.get_result(1) == 1.0) {
		cout << "Player 2 wins!" << endl;
	}
	else {
		cout << "Nobody wins!" << endl;
	}
}